

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_1::NoResetNotificationCase::iterate(NoResetNotificationCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  char *description;
  bool bVar4;
  deUint8 robustAccessGL;
  GLint reset;
  RenderingContext context;
  EGLint attribList [9];
  Functions gl;
  GLboolean local_1c4d;
  GLint local_1c4c;
  RenderingContext local_1c48;
  Enum<int,_2UL> local_1c18;
  Enum<int,_2UL> local_1c08;
  EGLint local_1bf8 [12];
  undefined1 local_1bc8 [120];
  ios_base local_1b50 [264];
  undefined1 local_1a48 [120];
  ios_base local_19d0 [1824];
  glGetBooleanvFunc local_12b0;
  glGetErrorFunc local_1248;
  glGetGraphicsResetStatusFunc local_1208;
  glGetIntegervFunc local_11e0;
  
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = (ostringstream *)(local_1a48 + 8);
  local_1a48._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a48,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19d0);
  local_1bf8[4] = 0x30bf;
  local_1bf8[5] = 1;
  local_1bf8[6] = 0x3138;
  local_1bf8[7] = 0x31be;
  local_1bf8[0] = 0x3098;
  local_1bf8[1] = 3;
  local_1bf8[2] = 0x30fb;
  local_1bf8[3] = 1;
  local_1bf8[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1bf8);
  local_1a48._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1c48,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1bf8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,(EGLContext *)local_1a48);
  RenderingContext::makeCurrent
            (&local_1c48,(EGLSurface *)(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)local_1a48);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_1c48.m_eglTestCtx,(Functions *)local_1c48.m_attribList);
  checkRequiredGLRobustnessExtension(local_1bf8,(Functions *)local_1a48);
  (*local_12b0)(0x90f3,&local_1c4d);
  GVar3 = (*local_1248)();
  glu::checkError(GVar3,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5bd);
  local_1c4c = 0;
  (*local_11e0)(0x8256,&local_1c4c);
  GVar3 = (*local_1248)();
  glu::checkError(GVar3,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5c1);
  bVar4 = local_1c4c != 0x8261;
  if (bVar4) {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    local_1bc8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Test failed! glGetIntegerv() returned wrong value. [",0x34);
    local_1c08.m_getName = glu::getErrorName;
    local_1c08.m_value = local_1c4c;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c08,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
    local_1c18.m_getName = glu::getErrorName;
    local_1c18.m_value = 0x8261;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c18,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1b50);
    description = "Fail";
  }
  else {
    (*local_1208)();
    GVar3 = (*local_1248)();
    glu::checkError(GVar3,"getGraphicsResetStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x5cd);
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar4,description);
  RenderingContext::~RenderingContext(&local_1c48);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_NO_RESET_NOTIFICATION,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_NO_RESET_NOTIFICATION)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << glu::getErrorStr(reset) << ", expected " << glu::getErrorStr(GL_NO_RESET_NOTIFICATION) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}